

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_config.cc
# Opt level: O3

EncConfig * __thiscall QPDFJob::EncConfig::annotate(EncConfig *this,string *parameter)

{
  int iVar1;
  int iVar2;
  
  iVar1 = ((this->config->o->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr)->keylen;
  iVar2 = std::__cxx11::string::compare((char *)parameter);
  (&((this->config->o->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    r2_annotate)[(ulong)(iVar1 != 0x28) * 4] = iVar2 == 0;
  return this;
}

Assistant:

QPDFJob::EncConfig*
QPDFJob::EncConfig::annotate(std::string const& parameter)
{
    if (config->o.m->keylen == 40) {
        config->o.m->r2_annotate = (parameter == "y");
    } else {
        config->o.m->r3_annotate_and_form = (parameter == "y");
    }
    return this;
}